

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O3

boolean encode_mcu_DC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  uint uVar2;
  phuff_entropy_ptr entropy;
  jpeg_destination_mgr *pjVar3;
  uint uVar4;
  long lVar5;
  
  entropy = (phuff_entropy_ptr)cinfo->entropy;
  iVar1 = cinfo->Al;
  pjVar3 = cinfo->dest;
  entropy->next_output_byte = pjVar3->next_output_byte;
  entropy->free_in_buffer = pjVar3->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy->restarts_to_go == 0)) {
    emit_restart(entropy,entropy->next_restart_num);
  }
  if (0 < cinfo->blocks_in_MCU) {
    lVar5 = 0;
    do {
      emit_bits(entropy,(int)(*MCU_data[lVar5])[0] >> ((byte)iVar1 & 0x1f),1);
      lVar5 = lVar5 + 1;
    } while (lVar5 < cinfo->blocks_in_MCU);
  }
  pjVar3 = cinfo->dest;
  pjVar3->next_output_byte = entropy->next_output_byte;
  pjVar3->free_in_buffer = entropy->free_in_buffer;
  uVar2 = cinfo->restart_interval;
  if (uVar2 != 0) {
    uVar4 = entropy->restarts_to_go;
    if (entropy->restarts_to_go == 0) {
      entropy->next_restart_num = entropy->next_restart_num + 1U & 7;
      uVar4 = uVar2;
    }
    entropy->restarts_to_go = uVar4 - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_DC_refine(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  unsigned char *st;
  int Al, blkn;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  st = entropy->fixed_bin;      /* use fixed probability estimation */
  Al = cinfo->Al;

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    /* We simply emit the Al'th bit of the DC coefficient value. */
    arith_encode(cinfo, st, (MCU_data[blkn][0][0] >> Al) & 1);
  }

  return TRUE;
}